

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ptls_openssl_decrypt_ticket
              (ptls_buffer_t *buf,ptls_iovec_t src,
              _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *cb)

{
  int iVar1;
  uchar local_88 [8];
  uint8_t hmac [64];
  size_t hmac_size;
  int ret;
  int clen;
  HMAC_CTX *hctx;
  EVP_CIPHER_CTX *cctx;
  _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *cb_local;
  ptls_buffer_t *buf_local;
  ptls_iovec_t src_local;
  
  src_local.base = (uint8_t *)src.len;
  buf_local = (ptls_buffer_t *)src.base;
  hctx = (HMAC_CTX *)0x0;
  _ret = (HMAC_CTX *)0x0;
  cctx = (EVP_CIPHER_CTX *)cb;
  cb_local = (_func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *)buf;
  hctx = (HMAC_CTX *)EVP_CIPHER_CTX_new();
  if ((EVP_CIPHER_CTX *)hctx == (EVP_CIPHER_CTX *)0x0) {
    hmac_size._0_4_ = 0x201;
  }
  else {
    _ret = (HMAC_CTX *)HMAC_CTX_new();
    if (_ret == (HMAC_CTX *)0x0) {
      hmac_size._0_4_ = 0x201;
    }
    else if (src_local.base < (uint8_t *)0x20) {
      hmac_size._0_4_ = 0x32;
    }
    else {
      iVar1 = (*(code *)cctx)(buf_local,&buf_local->off,hctx,_ret,0);
      if (iVar1 == 0) {
        hmac_size._0_4_ = 0x203;
      }
      else {
        hmac._56_8_ = HMAC_size(_ret);
        if (src_local.base < (uint8_t *)(hmac._56_8_ + 0x20)) {
          hmac_size._0_4_ = 0x32;
        }
        else {
          src_local.base = src_local.base + -hmac._56_8_;
          iVar1 = HMAC_Update(_ret,(uchar *)buf_local,(size_t)src_local.base);
          if ((iVar1 == 0) || (iVar1 = HMAC_Final(_ret,local_88,(uint *)0x0), iVar1 == 0)) {
            hmac_size._0_4_ = 0x203;
          }
          else {
            iVar1 = (*ptls_mem_equal)(src_local.base + (long)&buf_local->base,local_88,hmac._56_8_);
            if (iVar1 == 0) {
              hmac_size._0_4_ = 0x28;
            }
            else {
              buf_local = buf_local + 1;
              src_local.base = src_local.base + -0x20;
              hmac_size._0_4_ =
                   ptls_buffer_reserve((ptls_buffer_t *)cb_local,(size_t)src_local.base);
              if ((int)hmac_size == 0) {
                iVar1 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)hctx,
                                          (uchar *)(*(long *)cb_local + *(long *)(cb_local + 0x10)),
                                          (int *)((long)&hmac_size + 4),(uchar *)buf_local,
                                          (int)src_local.base);
                if (iVar1 == 0) {
                  hmac_size._0_4_ = 0x203;
                }
                else {
                  *(long *)(cb_local + 0x10) = (long)hmac_size._4_4_ + *(long *)(cb_local + 0x10);
                  iVar1 = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)hctx,
                                              (uchar *)(*(long *)cb_local +
                                                       *(long *)(cb_local + 0x10)),
                                              (int *)((long)&hmac_size + 4));
                  if (iVar1 == 0) {
                    hmac_size._0_4_ = 0x203;
                  }
                  else {
                    *(long *)(cb_local + 0x10) = (long)hmac_size._4_4_ + *(long *)(cb_local + 0x10);
                    hmac_size._0_4_ = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (hctx != (HMAC_CTX *)0x0) {
    EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)hctx);
  }
  if (_ret != (HMAC_CTX *)0x0) {
    HMAC_CTX_free(_ret);
  }
  return (int)hmac_size;
}

Assistant:

int ptls_openssl_decrypt_ticket(ptls_buffer_t *buf, ptls_iovec_t src,
                                int (*cb)(unsigned char *key_name, unsigned char *iv, EVP_CIPHER_CTX *ctx, HMAC_CTX *hctx, int enc))
{
    EVP_CIPHER_CTX *cctx = NULL;
    HMAC_CTX *hctx = NULL;
    int clen, ret;

    if ((cctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((hctx = HMAC_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* obtain cipher and hash context.
     * Note: no need to handle renew, since in picotls we always send a new ticket to minimize the chance of ticket reuse */
    if (src.len < TICKET_LABEL_SIZE + TICKET_IV_SIZE) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    if (!(*cb)(src.base, src.base + TICKET_LABEL_SIZE, cctx, hctx, 0)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    /* check hmac, and exclude label, iv, hmac */
    size_t hmac_size = HMAC_size(hctx);
    if (src.len < TICKET_LABEL_SIZE + TICKET_IV_SIZE + hmac_size) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    src.len -= hmac_size;
    uint8_t hmac[EVP_MAX_MD_SIZE];
    if (!HMAC_Update(hctx, src.base, src.len) || !HMAC_Final(hctx, hmac, NULL)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (!ptls_mem_equal(src.base + src.len, hmac, hmac_size)) {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        goto Exit;
    }
    src.base += TICKET_LABEL_SIZE + TICKET_IV_SIZE;
    src.len -= TICKET_LABEL_SIZE + TICKET_IV_SIZE;

    /* decrypt */
    if ((ret = ptls_buffer_reserve(buf, src.len)) != 0)
        goto Exit;
    if (!EVP_DecryptUpdate(cctx, buf->base + buf->off, &clen, src.base, (int)src.len)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    buf->off += clen;
    if (!EVP_DecryptFinal_ex(cctx, buf->base + buf->off, &clen)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    buf->off += clen;

    ret = 0;

Exit:
    if (cctx != NULL)
        EVP_CIPHER_CTX_free(cctx);
    if (hctx != NULL)
        HMAC_CTX_free(hctx);
    return ret;
}